

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

int get_first_flow_iter(pcp_flow_t *f,void *data)

{
  int iVar1;
  
  iVar1 = 0;
  if ((f->pcp_server_indx == *(uint32_t *)(*data + 0x10c)) && ((uint)f->state < 3)) {
    *(pcp_flow_t **)((long)data + 8) = f;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int get_first_flow_iter(pcp_flow_t *f, void *data) {
    struct get_first_flow_iter_data *d =
        (struct get_first_flow_iter_data *)data;

    if (f->pcp_server_indx != d->s->index) {
        return 0;
    }
    switch (f->state) {
    case pfs_idle:
    case pfs_wait_for_server_init:
    case pfs_send:
        d->msg = f;
        return 1;
    default:
        return 0;
    }
}